

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void bam_plp_reset(bam_plp_t iter)

{
  __linkbuf_t *p_Var1;
  lbnode_t *q;
  lbnode_t *p;
  bam_plp_t iter_local;
  
  iter->max_pos = -1;
  iter->max_tid = -1;
  iter->pos = 0;
  iter->tid = 0;
  iter->is_eof = 0;
  q = iter->head;
  while (q->next != (__linkbuf_t *)0x0) {
    overlap_remove(iter,(bam1_t *)0x0);
    p_Var1 = q->next;
    mp_free(iter->mp,q);
    q = p_Var1;
  }
  iter->head = iter->tail;
  return;
}

Assistant:

void bam_plp_reset(bam_plp_t iter)
{
    lbnode_t *p, *q;
    iter->max_tid = iter->max_pos = -1;
    iter->tid = iter->pos = 0;
    iter->is_eof = 0;
    for (p = iter->head; p->next;) {
        overlap_remove(iter, NULL);
        q = p->next;
        mp_free(iter->mp, p);
        p = q;
    }
    iter->head = iter->tail;
}